

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpn.cpp
# Opt level: O0

double util::rpn_eval_bitor(vector<double,_std::allocator<double>_> *args)

{
  uint uVar1;
  uint uVar2;
  reference pvVar3;
  vector<double,_std::allocator<double>_> *args_local;
  
  pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](args,0);
  uVar1 = d2i(*pvVar3);
  pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](args,1);
  uVar2 = d2i(*pvVar3);
  return (double)(int)(uVar1 | uVar2);
}

Assistant:

static double rpn_eval_bitor(std::vector<double> args) { return d2i(args[0]) | d2i(args[1]); }